

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O2

size_t xmi_process_EVNT(PBuffer *buffer,MidiFile *midi)

{
  byte bVar1;
  byte bVar2;
  element_type *_size;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint64_t uVar8;
  ulong uVar9;
  uint local_8c;
  MidiNode node;
  MidiNode subnode;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_8c = 0;
  uVar8 = 0;
  while( true ) {
    bVar4 = Buffer::readable((buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                            );
    _size = (buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (!bVar4) break;
    pbVar3 = _size->read;
    bVar1 = *pbVar3;
    _size->read = pbVar3 + 1;
    if ((long)(char)bVar1 < 0) {
      node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      uVar6 = local_8c + 1;
      uVar7 = bVar1 - 0x80 >> 4;
      node.time = uVar8;
      node.index = local_8c;
      node.type = bVar1;
      if ((0x4fU >> (uVar7 & 0x1f) & 1) == 0) {
        if ((0x30U >> (uVar7 & 0x1f) & 1) == 0) {
          if (bVar1 == 0xff) {
            node.data1 = pbVar3[1];
            _size->read = pbVar3 + 2;
            node.data2 = pbVar3[2];
            _size->read = pbVar3 + 3;
            Buffer::pop((Buffer *)&subnode,(size_t)_size);
            std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)&subnode);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&subnode.index);
            if ((node.data1 == 'Q') && (midi->tempo == 0)) {
              uVar7 = (uint)node.data2;
              uVar5 = 0;
              while (bVar4 = uVar7 != 0, uVar7 = uVar7 - 1, bVar4) {
                midi->tempo = uVar5 << 8;
                bVar1 = *(node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->read;
                (node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read =
                     (node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     read + 1;
                uVar5 = uVar5 << 8 | (uint)bVar1;
                midi->tempo = uVar5;
              }
            }
          }
        }
        else {
          node.data1 = pbVar3[1];
          _size->read = pbVar3 + 2;
          node.data2 = '\0';
        }
      }
      else {
        bVar2 = pbVar3[1];
        _size->read = pbVar3 + 2;
        node.data2 = pbVar3[2];
        _size->read = pbVar3 + 3;
        node.data1 = bVar2;
        if ((bVar1 & 0xf0) == 0x90) {
          std::vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>::
          push_back(&midi->nodes,&node);
          subnode.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          subnode.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          subnode.type = bVar1;
          std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_40,&buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
          uVar9 = 0;
          pbVar3 = (local_40._M_ptr)->read;
          while( true ) {
            bVar1 = *pbVar3;
            (local_40._M_ptr)->read = pbVar3 + 1;
            if (-1 < (char)bVar1) break;
            uVar9 = uVar9 * 0x80 | (ulong)(bVar1 & 0x7f);
            pbVar3 = pbVar3 + 1;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
          subnode.time = uVar9 * 0x80 + uVar8 + (ulong)bVar1;
          subnode.data2 = '\0';
          subnode.index = uVar6;
          subnode.data1 = bVar2;
          ConvertorXMI2MID::MidiNode::operator=(&node,&subnode);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&subnode.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          uVar6 = local_8c + 2;
        }
      }
      local_8c = uVar6;
      std::vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>::
      push_back(&midi->nodes,&node);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else {
      uVar8 = uVar8 + (long)(char)bVar1;
    }
  }
  return _size->size;
}

Assistant:

static size_t
xmi_process_EVNT(PBuffer buffer, MidiFile *midi) {
  uint64_t time = 0;
  unsigned int time_index = 0;

  while (buffer->readable()) {
    uint8_t type = buffer->pop<uint8_t>();

    if (type & 0x80) {
      ConvertorXMI2MID::MidiNode node;
      node.time = time;
      node.index = time_index++;
      node.type = type;

      switch (type & 0xF0) {
        case 0x80:
        case 0x90:
        case 0xA0:
        case 0xB0:
        case 0xE0:
          node.data1 = buffer->pop<uint8_t>();
          node.data2 = buffer->pop<uint8_t>();
          if ((type & 0xF0) == 0x90) {
            uint8_t data1 = node.data1;
            midi->nodes.push_back(node);

            ConvertorXMI2MID::MidiNode subnode;
            subnode.type = type;
            uint64_t length = midi_read_variable_size(buffer);

            // Generate on note with velocity zero corresponding to off note.
            subnode.time = time + length;
            subnode.index = time_index++;
            subnode.data1 = data1;
            subnode.data2 = 0;
            node = subnode;
          }
          break;
        case 0xC0:
        case 0xD0:
          node.data1 = buffer->pop<uint8_t>();
          node.data2 = 0;
          break;
        case 0xF0:
          if (type == 0xFF) {  // Meta message.
            node.data1 = buffer->pop<uint8_t>();
            node.data2 = buffer->pop<uint8_t>();
            node.buffer = buffer->pop(node.data2);
            if (node.data1 == 0x51) {
              if (midi->tempo == 0) {
                for (int i = 0; i < node.data2; i++) {
                  midi->tempo = midi->tempo << 8;
                  midi->tempo |= node.buffer->pop<uint8_t>();
                }
              }
            }
          }
          break;
      }

      midi->nodes.push_back(node);
    } else {
      time += type;
    }
  }

  return buffer->get_size();
}